

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

string * __thiscall
cmCustomCommandGenerator::GetInternalDepfileName
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,string *param_1,
          string *depfile)

{
  uint uVar1;
  string *a;
  string_view input;
  cmCryptoHash hash;
  string extension;
  string local_38;
  
  cmCryptoHash::cmCryptoHash(&hash,AlgoSHA256);
  extension._M_dataplus._M_p = (pointer)&extension.field_2;
  extension._M_string_length = 0;
  extension.field_2._M_local_buf[0] = '\0';
  uVar1 = (*this->LG->GlobalGenerator->_vptr_cmGlobalGenerator[0x34])();
  if (uVar1 < 3) {
    std::__cxx11::string::assign((char *)&extension);
  }
  a = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this->LG);
  input._M_str = (depfile->_M_dataplus)._M_p;
  input._M_len = depfile->_M_string_length;
  cmCryptoHash::HashString_abi_cxx11_(&local_38,&hash,input);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[15],std::__cxx11::string,std::__cxx11::string&>
            (__return_storage_ptr__,a,(char (*) [15])"/CMakeFiles/d/",&local_38,&extension);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&extension);
  cmCryptoHash::~cmCryptoHash(&hash);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetInternalDepfileName(
  const std::string& /*config*/, const std::string& depfile) const
{
  cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
  std::string extension;
  switch (*this->LG->GetGlobalGenerator()->DepfileFormat()) {
    case cmDepfileFormat::GccDepfile:
    case cmDepfileFormat::MakeDepfile:
      extension = ".d";
      break;
    case cmDepfileFormat::MSBuildAdditionalInputs:
      extension = ".AdditionalInputs";
      break;
  }
  return cmStrCat(this->LG->GetBinaryDirectory(), "/CMakeFiles/d/",
                  hash.HashString(depfile), extension);
}